

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4102ec::InlineImageTracker::~InlineImageTracker(InlineImageTracker *this)

{
  InlineImageTracker *this_local;
  
  ~InlineImageTracker(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

~InlineImageTracker() override = default;